

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermAggregate * __thiscall
glslang::HlslParseContext::handleSamplerTextureCombine
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *argTex,TIntermTyped *argSampler)

{
  TMap<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>_>
  *this_00;
  mapped_type ptVar1;
  HlslParseContext *pHVar2;
  int iVar3;
  TIntermAggregate *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar6;
  long lVar7;
  iterator iVar8;
  tShadowTextureSymbols *ptVar9;
  undefined4 extraout_var_05;
  TString *name;
  TVariable *pTVar10;
  undefined4 extraout_var_06;
  mapped_type *pptVar11;
  undefined4 extraout_var_07;
  int instances;
  uint uVar12;
  _Base_ptr p_Var13;
  uint uVar14;
  tShadowTextureSymbols tVar15;
  ulong uStack_120;
  longlong newId;
  HlslParseContext *local_100;
  ulong local_f8;
  TSourceLoc *local_f0;
  TIntermAggregate *local_e8;
  ulong local_e0;
  _Base_ptr local_d8;
  TSampler local_cc;
  TType texType;
  
  local_100 = this;
  pTVar4 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)loc);
  TIntermAggregate::TIntermAggregate(pTVar4,EOpConstructTextureSampler);
  iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar4);
  texType._vptr_TType = (_func_int **)argTex;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var,iVar3),(TIntermNode **)&texType);
  iVar3 = (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar4);
  texType._vptr_TType = (_func_int **)argSampler;
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
             CONCAT44(extraout_var_00,iVar3),(TIntermNode **)&texType);
  iVar3 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1e])(argTex);
  puVar5 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar3));
  uVar12 = *puVar5;
  iVar3 = (*(argSampler->super_TIntermNode)._vptr_TIntermNode[0x1e])(argSampler);
  lVar7 = *(long *)CONCAT44(extraout_var_02,iVar3);
  puVar5 = (uint *)(**(code **)(lVar7 + 0x40))((long *)CONCAT44(extraout_var_02,iVar3));
  instances = (int)lVar7;
  uVar14 = *puVar5;
  iVar3 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0xc])(argTex);
  plVar6 = (long *)CONCAT44(extraout_var_03,iVar3);
  if (plVar6 == (long *)0x0) {
    iVar3 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[8])(argTex);
    plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 400))
                               ((long *)CONCAT44(extraout_var_04,iVar3));
    lVar7 = *plVar6;
    plVar6 = (long *)(**(code **)(lVar7 + 0x60))(plVar6);
    instances = (int)lVar7;
    if (plVar6 == (long *)0x0) {
      (*(local_100->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (local_100,loc,"unable to find texture symbol","","");
      return (TIntermAggregate *)0x0;
    }
  }
  uVar14 = uVar14 & 0x20000;
  local_f8 = (ulong)uVar12;
  local_f0 = loc;
  local_e8 = pTVar4;
  lVar7 = (**(code **)(*plVar6 + 0x180))(plVar6);
  pHVar2 = local_100;
  this_00 = &local_100->textureShadowVariant;
  newId = lVar7;
  texType._vptr_TType = (_func_int **)(**(code **)(*plVar6 + 0x180))(plVar6);
  iVar8 = std::
          _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
          ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                  *)this_00,(key_type_conflict2 *)&texType);
  p_Var13 = &(pHVar2->textureShadowVariant).
             super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e0 = (ulong)uVar14;
  if (iVar8._M_node == p_Var13) {
    tVar15.symId._M_elems[1] = 1;
    tVar15.symId._M_elems[0] = -1;
    ptVar9 = NewPoolObject<glslang::HlslParseContext::tShadowTextureSymbols>
                       ((glslang *)0xffffffffffffffff,tVar15,instances);
    texType._vptr_TType = (_func_int **)(**(code **)(*plVar6 + 0x180))(plVar6);
    pptVar11 = std::
               map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
               ::operator[](&this_00->
                             super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                            ,(key_type_conflict2 *)&texType);
    *pptVar11 = ptVar9;
  }
  else {
    lVar7 = *(long *)(&(iVar8._M_node[1]._M_parent)->_M_color + (ulong)(uVar14 >> 0x11) * 2);
    newId = lVar7;
  }
  pTVar4 = local_e8;
  if (lVar7 != -1) goto LAB_0031925a;
  local_d8 = p_Var13;
  TType::TType(&texType,EbtVoid,EvqTemporary,1,0,0,false);
  iVar3 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1e])(argTex);
  TType::shallowCopy(&texType,(TType *)CONCAT44(extraout_var_05,iVar3));
  texType.sampler = (TSampler)((uint)texType.sampler & 0xfffdffff | (uint)local_e0);
  uVar12 = texType.qualifier._8_4_ & 0x7f;
  if (uVar12 == 0x10) {
    uStack_120 = 3;
LAB_003191fb:
    texType.qualifier._8_8_ = texType.qualifier._8_8_ & 0xffffffffffffff80 | uStack_120;
  }
  else if (uVar12 == 0x11) {
    uStack_120 = 4;
    goto LAB_003191fb;
  }
  name = (TString *)(**(code **)(*plVar6 + 400))(plVar6);
  pHVar2 = local_100;
  pTVar10 = makeInternalVariable(local_100,name,&texType);
  (*(pHVar2->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
            (pHVar2,pTVar10);
  iVar3 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xf])(pTVar10);
  newId = CONCAT44(extraout_var_06,iVar3);
  p_Var13 = local_d8;
  if (newId == -1) {
    __assert_fail("newId != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0xd2d,
                  "TIntermAggregate *glslang::HlslParseContext::handleSamplerTextureCombine(const TSourceLoc &, TIntermTyped *, TIntermTyped *)"
                 );
  }
LAB_0031925a:
  iVar8 = std::
          _Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
          ::find((_Rb_tree<long_long,_std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>,_std::_Select1st<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                  *)this_00,&newId);
  if (iVar8._M_node == p_Var13) {
    texType._vptr_TType = (_func_int **)(**(code **)(*plVar6 + 0x180))(plVar6);
    pptVar11 = std::
               map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
               ::operator[](&this_00->
                             super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                            ,(key_type_conflict2 *)&texType);
    ptVar1 = *pptVar11;
    pptVar11 = std::
               map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
               ::operator[](&this_00->
                             super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                            ,&newId);
    *pptVar11 = ptVar1;
  }
  pptVar11 = std::
             map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
             ::operator[](&this_00->
                           super_map<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*>_>_>
                          ,&newId);
  uVar12 = (uint)local_e0;
  *(longlong *)((long)((*pptVar11)->symId)._M_elems + (local_e0 >> 0xe & 0x3ffff)) = newId;
  iVar3 = (*(argTex->super_TIntermNode)._vptr_TIntermNode[0x1f])(argTex);
  puVar5 = (uint *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x48))
                             ((long *)CONCAT44(extraout_var_07,iVar3));
  *puVar5 = *puVar5 & 0xfffdffff | uVar12;
  local_cc = (TSampler)(((uint)local_f8 & 0xffedffff) + uVar12 + 0x100000);
  (**(code **)(*plVar6 + 0x1a8))(plVar6,newId);
  TType::TType(&texType,&local_cc,EvqTemporary,(TArraySizes *)0x0);
  (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (pTVar4,&texType);
  (*(pTVar4->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
            (pTVar4,local_f0);
  return pTVar4;
}

Assistant:

TIntermAggregate* HlslParseContext::handleSamplerTextureCombine(const TSourceLoc& loc, TIntermTyped* argTex,
                                                                TIntermTyped* argSampler)
{
    TIntermAggregate* txcombine = new TIntermAggregate(EOpConstructTextureSampler);

    txcombine->getSequence().push_back(argTex);
    txcombine->getSequence().push_back(argSampler);

    TSampler samplerType = argTex->getType().getSampler();
    samplerType.combined = true;

    // TODO:
    // This block exists until the spec no longer requires shadow modes on texture objects.
    // It can be deleted after that, along with the shadowTextureVariant member.
    {
        const bool shadowMode = argSampler->getType().getSampler().shadow;

        TIntermSymbol* texSymbol = argTex->getAsSymbolNode();

        if (texSymbol == nullptr)
            texSymbol = argTex->getAsBinaryNode()->getLeft()->getAsSymbolNode();

        if (texSymbol == nullptr) {
            error(loc, "unable to find texture symbol", "", "");
            return nullptr;
        }

        // This forces the texture's shadow state to be the sampler's
        // shadow state.  This depends on downstream optimization to
        // DCE one variant in [shadow, nonshadow] if both are present,
        // or the SPIR-V module would be invalid.
        long long newId = texSymbol->getId();

        // Check to see if this texture has been given a shadow mode already.
        // If so, look up the one we already have.
        const auto textureShadowEntry = textureShadowVariant.find(texSymbol->getId());

        if (textureShadowEntry != textureShadowVariant.end())
            newId = textureShadowEntry->second->get(shadowMode);
        else
            textureShadowVariant[texSymbol->getId()] = NewPoolObject(tShadowTextureSymbols(), 1);

        // Sometimes we have to create another symbol (if this texture has been seen before,
        // and we haven't created the form for this shadow mode).
        if (newId == -1) {
            TType texType;
            texType.shallowCopy(argTex->getType());
            texType.getSampler().shadow = shadowMode;  // set appropriate shadow mode.
            globalQualifierFix(loc, texType.getQualifier());

            TVariable* newTexture = makeInternalVariable(texSymbol->getName(), texType);

            trackLinkage(*newTexture);

            newId = newTexture->getUniqueId();
        }

        assert(newId != -1);

        if (textureShadowVariant.find(newId) == textureShadowVariant.end())
            textureShadowVariant[newId] = textureShadowVariant[texSymbol->getId()];

        textureShadowVariant[newId]->set(shadowMode, newId);

        // Remember this shadow mode in the texture and the merged type.
        argTex->getWritableType().getSampler().shadow = shadowMode;
        samplerType.shadow = shadowMode;

        texSymbol->switchId(newId);
    }

    txcombine->setType(TType(samplerType, EvqTemporary));
    txcombine->setLoc(loc);

    return txcombine;
}